

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

PragmaName * pragmaLocate(char *zName)

{
  char *zRight;
  int iVar1;
  PragmaName *pPVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  bVar3 = false;
  iVar6 = 0x39;
  iVar5 = 0;
  do {
    iVar4 = (iVar6 + iVar5) / 2;
    zRight = aPragmaName[iVar4].zName;
    if (zName == (char *)0x0) {
      iVar1 = -(uint)(zRight != (char *)0x0);
    }
    else if (zRight == (char *)0x0) {
      iVar1 = 1;
    }
    else {
      iVar1 = sqlite3StrICmp(zName,zRight);
    }
    if (iVar1 == 0) break;
    if (iVar1 < 0) {
      iVar6 = iVar4 + -1;
    }
    else {
      iVar5 = iVar4 + 1;
    }
    bVar3 = iVar6 < iVar5;
  } while (iVar5 <= iVar6);
  pPVar2 = (PragmaName *)0x0;
  if (!bVar3) {
    pPVar2 = aPragmaName + iVar4;
  }
  return pPVar2;
}

Assistant:

static const PragmaName *pragmaLocate(const char *zName){
  int upr, lwr, mid = 0, rc;
  lwr = 0;
  upr = ArraySize(aPragmaName)-1;
  while( lwr<=upr ){
    mid = (lwr+upr)/2;
    rc = sqlite3_stricmp(zName, aPragmaName[mid].zName);
    if( rc==0 ) break;
    if( rc<0 ){
      upr = mid - 1;
    }else{
      lwr = mid + 1;
    }
  }
  return lwr>upr ? 0 : &aPragmaName[mid];
}